

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.cpp
# Opt level: O2

int crypto::sha256_transform::init(EVP_PKEY_CTX *ctx)

{
  int in_EAX;
  
  *(undefined8 *)ctx = 0xbb67ae856a09e667;
  *(undefined8 *)(ctx + 8) = 0xa54ff53a3c6ef372;
  *(undefined8 *)(ctx + 0x10) = 0x9b05688c510e527f;
  *(undefined8 *)(ctx + 0x18) = 0x5be0cd191f83d9ab;
  return in_EAX;
}

Assistant:

void sha256_transform::init(hash_word * state) {
	state[0] = 0x6a09e667;
	state[1] = 0xbb67ae85;
	state[2] = 0x3c6ef372;
	state[3] = 0xa54ff53a;
	state[4] = 0x510e527f;
	state[5] = 0x9b05688c;
	state[6] = 0x1f83d9ab;
	state[7] = 0x5be0cd19;
}